

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

short jsteemann::atoi_positive<short>(char *p,char *e,bool *valid)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  
  if (p == e) {
    bVar3 = false;
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00128987:
        bVar3 = false;
        goto LAB_00128984;
      }
      bVar2 = *p - 0x30;
      if ((0xccc < sVar1) || (sVar1 == 0xccc && 7 < bVar2)) goto LAB_00128987;
      sVar1 = (ushort)bVar2 + sVar1 * 10;
      p = p + 1;
    } while (p < e);
    bVar3 = true;
  }
LAB_00128984:
  *valid = bVar3;
  return sVar1;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      valid = false;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      valid = false;
      return result;
    } 
    result *= 10;
    result += c;
  } while (++p < e);

  valid = true;
  return result;
}